

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkBinaryRegistry.cpp
# Opt level: O3

string * __thiscall
vk::BinaryRegistryDetail::anon_unknown_8::getProgramPath
          (string *__return_storage_ptr__,anon_unknown_8 *this,string *dirName,deUint32 index)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  long lVar3;
  long *plVar4;
  string *extraout_RAX;
  string *extraout_RAX_00;
  string *extraout_RAX_01;
  string *extraout_RAX_02;
  string *psVar5;
  long *plVar6;
  long *plVar7;
  long local_238;
  long lStack_230;
  FilePath local_228;
  FilePath local_208;
  undefined1 local_1e8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  long local_1b8 [2];
  Hex<8UL> local_1a8;
  ostringstream local_1a0 [112];
  ios_base local_130 [264];
  
  paVar1 = &local_208.m_path.field_2;
  local_208.m_path._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_208,this,this + (long)&dirName->_M_dataplus);
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  local_1a8.value = (deUint64)index;
  tcu::Format::Hex<8UL>::toStream(&local_1a8,(ostream *)local_1a0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  std::ios_base::~ios_base(local_130);
  plVar4 = (long *)std::__cxx11::string::append(local_1c8._M_local_buf);
  plVar6 = plVar4 + 2;
  if ((long *)*plVar4 == plVar6) {
    local_238 = *plVar6;
    lStack_230 = plVar4[3];
    plVar7 = &local_238;
  }
  else {
    local_238 = *plVar6;
    plVar7 = (long *)*plVar4;
  }
  lVar3 = plVar4[1];
  *plVar4 = (long)plVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if ((long *)local_1c8._M_allocated_capacity != local_1b8) {
    operator_delete((void *)local_1c8._M_allocated_capacity,local_1b8[0] + 1);
  }
  paVar2 = &local_228.m_path.field_2;
  local_228.m_path._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_228,plVar7,lVar3 + (long)plVar7);
  de::FilePath::join((FilePath *)local_1e8,&local_208,&local_228);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,(char *)local_1e8._0_8_,(allocator<char> *)local_1a0);
  psVar5 = (string *)(local_1e8 + 0x10);
  if ((string *)local_1e8._0_8_ != psVar5) {
    operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ + 1);
    psVar5 = extraout_RAX;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228.m_path._M_dataplus._M_p != paVar2) {
    operator_delete(local_228.m_path._M_dataplus._M_p,
                    local_228.m_path.field_2._M_allocated_capacity + 1);
    psVar5 = extraout_RAX_00;
  }
  if (plVar7 != &local_238) {
    operator_delete(plVar7,local_238 + 1);
    psVar5 = extraout_RAX_01;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208.m_path._M_dataplus._M_p != paVar1) {
    operator_delete(local_208.m_path._M_dataplus._M_p,
                    local_208.m_path.field_2._M_allocated_capacity + 1);
    psVar5 = extraout_RAX_02;
  }
  return psVar5;
}

Assistant:

string getProgramPath (const std::string& dirName, deUint32 index)
{
	return de::FilePath::join(dirName, getProgramFileName(index)).getPath();
}